

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O0

void __thiscall DBaseStatusBar::DrINumber(DBaseStatusBar *this,int val,int x,int y,int imgBase)

{
  FTexture *pFVar1;
  int iVar2;
  int oldval;
  int imgBase_local;
  int y_local;
  int x_local;
  int val_local;
  DBaseStatusBar *this_local;
  
  y_local = val;
  if (999 < val) {
    y_local = 999;
  }
  if (y_local < 0) {
    if (y_local < -9) {
      pFVar1 = FImageCollection::operator[](&this->Images,0);
      DrawImage(this,pFVar1,x + 1,y + 1,(FRemapTable *)0x0);
    }
    else {
      pFVar1 = FImageCollection::operator[](&this->Images,imgBase - y_local);
      DrawImage(this,pFVar1,x + 0x12,y,(FRemapTable *)0x0);
      pFVar1 = FImageCollection::operator[](&this->Images,1);
      DrawImage(this,pFVar1,x + 9,y,(FRemapTable *)0x0);
    }
  }
  else {
    if (99 < y_local) {
      pFVar1 = FImageCollection::operator[](&this->Images,imgBase + y_local / 100);
      DrawImage(this,pFVar1,x,y,(FRemapTable *)0x0);
    }
    iVar2 = y_local % 100;
    if ((9 < iVar2) || (99 < y_local)) {
      pFVar1 = FImageCollection::operator[](&this->Images,imgBase + iVar2 / 10);
      DrawImage(this,pFVar1,x + 9,y,(FRemapTable *)0x0);
    }
    pFVar1 = FImageCollection::operator[](&this->Images,imgBase + iVar2 % 10);
    DrawImage(this,pFVar1,x + 0x12,y,(FRemapTable *)0x0);
  }
  return;
}

Assistant:

void DBaseStatusBar::DrINumber (signed int val, int x, int y, int imgBase) const
{
	int oldval;

	if (val > 999)
		val = 999;
	oldval = val;
	if (val < 0)
	{
		if (val < -9)
		{
			DrawImage (Images[imgLAME], x+1, y+1);
			return;
		}
		val = -val;
		DrawImage (Images[imgBase+val], x+18, y);
		DrawImage (Images[imgNEGATIVE], x+9, y);
		return;
	}
	if (val > 99)
	{
		DrawImage (Images[imgBase+val/100], x, y);
	}
	val = val % 100;
	if (val > 9 || oldval > 99)
	{
		DrawImage (Images[imgBase+val/10], x+9, y);
	}
	val = val % 10;
	DrawImage (Images[imgBase+val], x+18, y);
}